

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_buffer_file(uchar *out,size_t size,char *filename)

{
  FILE *__stream;
  size_t sVar1;
  size_t readsize;
  FILE *file;
  char *filename_local;
  size_t size_local;
  uchar *out_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    out_local._4_4_ = 0x4e;
  }
  else {
    sVar1 = fread(out,1,size,__stream);
    fclose(__stream);
    if (sVar1 == size) {
      out_local._4_4_ = 0;
    }
    else {
      out_local._4_4_ = 0x4e;
    }
  }
  return out_local._4_4_;
}

Assistant:

static unsigned lodepng_buffer_file(unsigned char* out, size_t size, const char* filename) {
  FILE* file;
  size_t readsize;
  file = fopen(filename, "rb");
  if(!file) return 78;

  readsize = fread(out, 1, size, file);
  fclose(file);

  if(readsize != size) return 78;
  return 0;
}